

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_util_load_mmaped_file(char *zFile,void **ppMap,unqlite_int64 *pFileSize)

{
  int iVar1;
  
  if ((((zFile != (char *)0x0) && (pFileSize != (unqlite_int64 *)0x0)) && (ppMap != (void **)0x0))
     && (*zFile != '\0')) {
    *ppMap = (void *)0x0;
    iVar1 = UnixVfs_Mmap(zFile,ppMap,pFileSize);
    return iVar1;
  }
  return -0x18;
}

Assistant:

UNQLITE_APIEXPORT int unqlite_util_load_mmaped_file(const char *zFile,void **ppMap,unqlite_int64 *pFileSize)
{
	const jx9_vfs *pVfs;
	int rc;
	if( SX_EMPTY_STR(zFile) || ppMap == 0 || pFileSize == 0){
		/* Sanity check */
		return UNQLITE_CORRUPT;
	}
	*ppMap = 0;
	/* Extract the Jx9 Vfs */
	pVfs = jx9ExportBuiltinVfs();
	/*
	 * Check if the underlying vfs implement the memory map routines
	 * [i.e: mmap() under UNIX/MapViewOfFile() under windows].
	 */
	if( pVfs == 0 || pVfs->xMmap == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	 }else{ 
		 /* Try to get a read-only memory view of the whole file */
		 rc = pVfs->xMmap(zFile,ppMap,pFileSize);
	 }
	return rc;
}